

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

float32 likelhddec(float32 *meana,float32 *vara,float32 *meanb,float32 *varb,float32 **cnta,
                  float32 **cntb,int32 ndensity,int32 nfeat,int32 dim,int32 continuous)

{
  cmd_ln_t *cmdln;
  ulong uVar1;
  ulong uVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float local_64;
  
  if (continuous == 0) {
    if (nfeat < 1) {
      local_64 = 0.0;
    }
    else {
      uVar1 = 0;
      local_64 = 0.0;
      do {
        if (ndensity < 1) {
          fVar8 = 0.0;
          fVar10 = 0.0;
        }
        else {
          fVar10 = 0.0;
          uVar2 = 0;
          fVar8 = 0.0;
          do {
            fVar11 = (float)cnta[uVar1][uVar2];
            fVar10 = fVar10 + (float)cntb[uVar1][uVar2];
            dVar5 = 0.0;
            if ((fVar11 != 0.0) || (NAN(fVar11))) {
              dVar5 = log((double)fVar11);
              dVar5 = dVar5 * (double)fVar11;
            }
            dVar6 = 0.0;
            fVar3 = (float)cntb[uVar1][uVar2];
            if ((fVar3 != 0.0) || (NAN(fVar3))) {
              dVar6 = log((double)fVar3);
              dVar6 = dVar6 * (double)fVar3;
            }
            fVar3 = (float)cnta[uVar1][uVar2] + (float)cntb[uVar1][uVar2];
            dVar7 = 0.0;
            if ((fVar3 != 0.0) || (NAN(fVar3))) {
              dVar7 = log((double)fVar3);
              dVar7 = dVar7 * (double)fVar3;
            }
            fVar8 = fVar8 + fVar11;
            local_64 = (float)((double)local_64 + ((dVar5 + dVar6) - dVar7));
            uVar2 = uVar2 + 1;
          } while ((uint)ndensity != uVar2);
        }
        dVar5 = 0.0;
        if ((fVar8 != 0.0) || (NAN(fVar8))) {
          dVar5 = log((double)fVar8);
          dVar5 = dVar5 * (double)fVar8;
        }
        dVar6 = 0.0;
        if ((fVar10 != 0.0) || (NAN(fVar10))) {
          dVar6 = log((double)fVar10);
          dVar6 = dVar6 * (double)fVar10;
        }
        fVar8 = fVar8 + fVar10;
        dVar7 = 0.0;
        if ((fVar8 != 0.0) || (NAN(fVar8))) {
          dVar7 = log((double)fVar8);
          dVar7 = dVar7 * (double)fVar8;
        }
        local_64 = (float)((double)local_64 - ((dVar5 + dVar6) - dVar7));
        uVar1 = uVar1 + 1;
      } while (uVar1 != (uint)nfeat);
    }
  }
  else {
    cmdln = cmd_ln_get();
    dVar5 = cmd_ln_float_r(cmdln,"-varfloor");
    fVar8 = (float)**cnta + (float)**cntb;
    if (dim < 1) {
      fVar3 = 0.0;
      fVar11 = 0.0;
      fVar10 = 0.0;
    }
    else {
      fVar3 = 0.0;
      uVar1 = 0;
      fVar10 = 0.0;
      fVar11 = 0.0;
      do {
        fVar9 = (float)meana[uVar1];
        fVar4 = (float)meanb[uVar1];
        fVar12 = ((float)**cnta * fVar9 + (float)**cntb * fVar4) / fVar8;
        fVar4 = ((fVar9 * fVar9 + (float)vara[uVar1]) * (float)**cnta +
                (fVar4 * fVar4 + (float)varb[uVar1]) * (float)**cntb) / fVar8 - fVar12 * fVar12;
        fVar9 = (float)dVar5;
        if ((float)dVar5 <= fVar4) {
          fVar9 = fVar4;
        }
        dVar6 = log((double)fVar9);
        fVar10 = fVar10 + (float)dVar6;
        dVar6 = log((double)(float)varb[uVar1]);
        fVar11 = fVar11 + (float)dVar6;
        dVar6 = log((double)(float)vara[uVar1]);
        fVar3 = fVar3 + (float)dVar6;
        uVar1 = uVar1 + 1;
      } while ((uint)dim != uVar1);
    }
    local_64 = ((fVar8 * fVar10 - fVar11 * (float)**cntb) - fVar3 * (float)**cnta) * 0.5;
  }
  return (float32)local_64;
}

Assistant:

float32    likelhddec(float32 *meana, float32 *vara,
                      float32 *meanb, float32 *varb,
                      float32 **cnta, float32 **cntb,
                      int32 ndensity, int32 nfeat, int32 dim, int32 continuous)
{
    int32   i;
    float32 cntc, la, lb, lc, nm, nv, lkdec, minvar;

    if (continuous) {
        minvar = cmd_ln_float32("-varfloor");
        cntc = cnta[0][0] + cntb[0][0];

        for (i=0, lc=0, lb=0, la=0;i<dim;i++){
            nm = (cnta[0][0]*meana[i] + cntb[0][0]*meanb[i])/cntc;
            nv = cnta[0][0]*(vara[i]+meana[i]*meana[i])+
                 cntb[0][0]*(varb[i]+meanb[i]*meanb[i]);
            nv = nv/cntc - nm*nm;
            if (nv < minvar) nv = minvar;
            lc += (float32)log(nv);
            lb += (float32)log(varb[i]);
            la += (float32)log(vara[i]);
        }
        lkdec = 0.5*(cntc*lc - cntb[0][0]*lb - cnta[0][0]*la);
    }
    else {
        int32 j;
        float32 P,Q;
        for (i=0,lkdec = 0; i < nfeat; i++) {
            for (j=0,P=0,Q=0; j < ndensity; j++) {
                P += cnta[i][j]; Q += cntb[i][j];
                lkdec += ((cnta[i][j]==0) ? 0 : cnta[i][j]*log(cnta[i][j]))
		       + ((cntb[i][j]==0) ? 0 : cntb[i][j]*log(cntb[i][j]))
		       - (((cnta[i][j]+cntb[i][j])==0) ? 0 : 
			  (cnta[i][j]+cntb[i][j])*log(cnta[i][j]+cntb[i][j]));
            }
            lkdec -= 
		((P==0) ? 0 : (P*log(P))) +
		((Q==0) ? 0 : (Q*log(Q))) -
		(((P+Q)==0) ? 0 : ((P+Q)*log(P+Q)));
        }
#if 0
        /* The old code, assumed log(0) would give a reasonable answer */
	for (i=0,lkdec = 0; i < nfeat; i++) {
            for (j=0,P=0,Q=0; j < ndensity; j++) {
                P += cnta[i][j]; Q += cntb[i][j];
                lkdec += cnta[i][j]*log(cnta[i][j]) + cntb[i][j]*log(cntb[i][j])
                           -(cnta[i][j]+cntb[i][j])*log(cnta[i][j]+cntb[i][j]);
            }
            lkdec -= P*log(P) + Q*log(Q) - (P+Q)*log(P+Q);
        }
#endif 
    }

    return(lkdec);
}